

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventHandler.cpp
# Opt level: O3

void __thiscall TgBot::EventHandler::handleUpdate(EventHandler *this,Ptr *update)

{
  element_type *peVar1;
  element_type *peVar2;
  EventBroadcaster *pEVar3;
  element_type *peVar4;
  element_type *peVar5;
  Ptr local_50;
  Ptr local_40;
  Ptr local_30;
  Ptr local_20;
  
  peVar1 = (update->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2 = (peVar1->inlineQuery).super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 != (element_type *)0x0) {
    pEVar3 = this->_broadcaster;
    local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (peVar1->inlineQuery).super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    EventBroadcaster::broadcastInlineQuery(pEVar3,&local_20);
    if (local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  peVar1 = (update->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar4 = (peVar1->chosenInlineResult).
           super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4 != (element_type *)0x0) {
    pEVar3 = this->_broadcaster;
    local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (peVar1->chosenInlineResult).
            super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    if (local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar4;
    EventBroadcaster::broadcastChosenInlineResult(pEVar3,&local_30);
    if (local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  peVar1 = (update->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar5 = (peVar1->callbackQuery).
           super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar5 != (element_type *)0x0) {
    pEVar3 = this->_broadcaster;
    local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (peVar1->callbackQuery).
           super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    EventBroadcaster::broadcastCallbackQuery(pEVar3,&local_40);
    if (local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  peVar1 = (update->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->message).super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (peVar1->message).super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    handleMessage(this,&local_50);
    if (local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
  }
  return;
}

Assistant:

void EventHandler::handleUpdate(Update::Ptr update) const {
    if (update->inlineQuery != nullptr) {
        _broadcaster.broadcastInlineQuery(update->inlineQuery);
    }
    if (update->chosenInlineResult != nullptr) {
        _broadcaster.broadcastChosenInlineResult(update->chosenInlineResult);
    }
    if (update->callbackQuery != nullptr) {
        _broadcaster.broadcastCallbackQuery(update->callbackQuery);
    }
    if (update->message != nullptr) {
        handleMessage(update->message);
    }
}